

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O0

void __thiscall DnsStats::SubmitCborPacket(DnsStats *this,cdns *cdns_ctx,size_t packet_id)

{
  uint8_t *addr;
  bool bVar1;
  bool bVar2;
  uint32_t uVar3;
  reference query_00;
  size_type __n;
  reference pvVar4;
  bool is_udp;
  size_t c_address_id;
  cdns_query_signature *q_sig;
  cdns_query *query;
  bool unfiltered;
  size_t packet_id_local;
  cdns *cdns_ctx_local;
  DnsStats *this_local;
  
  query_00 = std::vector<cdns_query,_std::allocator<cdns_query>_>::operator[]
                       (&(cdns_ctx->block).queries,packet_id);
  c_address_id = 0;
  __n = (long)query_00->client_address_index - (long)cdns_ctx->index_offset;
  if (cdns_ctx->index_offset <= query_00->query_signature_index) {
    c_address_id = (size_t)std::vector<cdns_query_signature,_std::allocator<cdns_query_signature>_>
                           ::operator[](&(cdns_ctx->block).tables.q_sigs,
                                        (long)query_00->query_signature_index -
                                        (long)cdns_ctx->index_offset);
  }
  if ((this->t_start_sec == 0) && (this->t_start_usec == 0)) {
    this->t_start_sec = (uint32_t)(cdns_ctx->block).preamble.earliest_time_sec;
    this->t_start_usec = (uint32_t)(cdns_ctx->block).preamble.earliest_time_usec;
  }
  this->volume_53only = (long)query_00->query_size + this->volume_53only;
  this->volume_53only = (long)query_00->response_size + this->volume_53only;
  uVar3 = AddressFilter::GetCount(&this->rootAddresses);
  if (uVar3 == 0) {
    AddressFilter::SetList(&this->rootAddresses,DefaultRootAddresses,0x1c);
  }
  pvVar4 = std::vector<cbor_bytes,_std::allocator<cbor_bytes>_>::operator[]
                     (&(cdns_ctx->block).tables.addresses,__n);
  addr = pvVar4->v;
  pvVar4 = std::vector<cbor_bytes,_std::allocator<cbor_bytes>_>::operator[]
                     (&(cdns_ctx->block).tables.addresses,__n);
  bVar1 = CheckAddress(this,addr,pvVar4->l);
  bVar2 = cdns::is_old_version(cdns_ctx);
  if (bVar2) {
    bVar2 = true;
    if (c_address_id != 0) {
      bVar2 = (*(uint *)(c_address_id + 0x10) & 1) == 0;
    }
  }
  else {
    bVar2 = true;
    if (c_address_id != 0) {
      bVar2 = (*(int *)(c_address_id + 0x10) >> 1 & 0xfU) == 0;
    }
  }
  if (((bVar1) && (c_address_id != 0)) && ((bVar2 || ((this->dnsstat_flags & 0x40) != 0)))) {
    if ((*(uint *)(c_address_id + 0x18) & 1) != 0) {
      this->query_count = this->query_count + 1;
      SubmitCborPacketQuery(this,cdns_ctx,query_00,(cdns_query_signature *)c_address_id);
    }
    if ((*(uint *)(c_address_id + 0x18) & 0x32) != 0) {
      this->response_count = this->response_count + 1;
      SubmitCborPacketResponse(this,cdns_ctx,query_00,(cdns_query_signature *)c_address_id);
    }
  }
  return;
}

Assistant:

void DnsStats::SubmitCborPacket(cdns* cdns_ctx, size_t packet_id)
{
    bool unfiltered = false;
    cdns_query* query = &cdns_ctx->block.queries[packet_id];
    cdns_query_signature* q_sig = NULL; 
    size_t c_address_id = (size_t)query->client_address_index - cdns_ctx->index_offset;
    bool is_udp;

    if (query->query_signature_index >= cdns_ctx->index_offset) {
        q_sig = &cdns_ctx->block.tables.q_sigs[(size_t)query->query_signature_index - cdns_ctx->index_offset];
    }

    if (t_start_sec == 0 && t_start_usec == 0) {
        t_start_sec = (uint32_t)cdns_ctx->block.preamble.earliest_time_sec;
        t_start_usec = (uint32_t)cdns_ctx->block.preamble.earliest_time_usec;
    }

    volume_53only += query->query_size;
    volume_53only += query->response_size;

    if (rootAddresses.GetCount() == 0)
    {
        rootAddresses.SetList(DefaultRootAddresses, sizeof(DefaultRootAddresses) / sizeof(char const*));
    }

    unfiltered = CheckAddress(cdns_ctx->block.tables.addresses[c_address_id].v,
        cdns_ctx->block.tables.addresses[c_address_id].l);

    if (cdns_ctx->is_old_version()) {
        is_udp = (q_sig == NULL) || (q_sig->qr_transport_flags & 1) == 0;
    }
    else {
        is_udp = (q_sig == NULL) || ((q_sig->qr_transport_flags >> 1)&0xF) == 0;
    }

    if (unfiltered && q_sig != NULL &&
        ( is_udp || (dnsstat_flags& dnsStateFlagIncludeTcpRecords) != 0))
    {
        /* Some QSIG flags bits vary between RFC and draft, but bit 0 and bit 5 have the same meaning. */
        if ((q_sig->qr_sig_flags&0x01) != 0)
        {
            query_count++;

            SubmitCborPacketQuery(cdns_ctx, query, q_sig);
        }

        if ((q_sig->qr_sig_flags & 0x32) != 0)
        {
            response_count++;

            SubmitCborPacketResponse(cdns_ctx, query, q_sig);
        }
    }
}